

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O0

void __thiscall
S2ClosestEdgeQueryBase<S2MinDistance>::FindClosestEdgesBruteForce
          (S2ClosestEdgeQueryBase<S2MinDistance> *this)

{
  bool bVar1;
  int iVar2;
  S2Shape *shape_00;
  ShapeIterator SVar3;
  ShapeIterator it;
  int local_78;
  int e;
  int num_edges;
  S2Shape *shape;
  ShapeIterator __end1;
  undefined1 local_28 [8];
  ShapeIterator __begin1;
  S2ShapeIndex *__range1;
  S2ClosestEdgeQueryBase<S2MinDistance> *this_local;
  
  __begin1._8_8_ = this->index_;
  SVar3 = S2ShapeIndex::begin((S2ShapeIndex *)__begin1._8_8_);
  local_28 = (undefined1  [8])SVar3.index_;
  __begin1.index_._0_4_ = SVar3.shape_id_;
  SVar3 = S2ShapeIndex::end((S2ShapeIndex *)__begin1._8_8_);
  while (it._12_4_ = 0, it.index_ = (S2ShapeIndex *)SUB128(SVar3._0_12_,0),
        it.shape_id_ = SUB124(SVar3._0_12_,8),
        bVar1 = S2ShapeIndex::ShapeIterator::operator!=((ShapeIterator *)local_28,it), bVar1) {
    shape_00 = S2ShapeIndex::ShapeIterator::operator*((ShapeIterator *)local_28);
    if (shape_00 != (S2Shape *)0x0) {
      iVar2 = (*shape_00->_vptr_S2Shape[2])();
      for (local_78 = 0; local_78 < iVar2; local_78 = local_78 + 1) {
        MaybeAddResult(this,shape_00,local_78);
      }
    }
    S2ShapeIndex::ShapeIterator::operator++((ShapeIterator *)local_28);
  }
  return;
}

Assistant:

void S2ClosestEdgeQueryBase<Distance>::FindClosestEdgesBruteForce() {
  for (S2Shape* shape : *index_) {
    if (shape == nullptr) continue;
    int num_edges = shape->num_edges();
    for (int e = 0; e < num_edges; ++e) {
      MaybeAddResult(*shape, e);
    }
  }
}